

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O0

bool __thiscall GGSock::Communicator::Data::update(Data *this)

{
  Data *in_RDI;
  Data *in_stack_00000008;
  lock_guard<std::mutex> lock_1;
  lock_guard<std::mutex> lock;
  Data *in_stack_00000060;
  mutex_type *in_stack_ffffffffffffffc8;
  Data *in_stack_fffffffffffffff0;
  Data *this_00;
  
  this_00 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffc8);
  if ((((ulong)*(mutex_type **)&in_RDI->isServer & 1) == 0) || ((in_RDI->isListening & 1U) == 0)) {
    if ((((ulong)*(mutex_type **)&in_RDI->isServer & 1) == 0) ||
       (((in_RDI->isListening & 1U) != 0 || ((in_RDI->isConnected & 1U) == 0)))) {
      if ((((ulong)*(mutex_type **)&in_RDI->isServer & 1) == 0) &&
         ((in_RDI->isConnecting & 1U) != 0)) {
        doConnect(in_stack_00000008);
      }
      else if (((((ulong)*(mutex_type **)&in_RDI->isServer & 1) == 0) &&
               ((in_RDI->isConnecting & 1U) == 0)) && ((in_RDI->isConnected & 1U) != 0)) {
        doRead(in_stack_00000060);
      }
    }
    else {
      doRead(in_stack_00000060);
    }
  }
  else {
    doListen(this_00);
  }
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffc8);
  if (((in_RDI->isConnected & 1U) != 0) && (in_RDI->rbHead != in_RDI->rbEnd)) {
    doSend(in_stack_fffffffffffffff0);
  }
  if ((in_RDI->isConnected & 1U) == 0) {
    in_RDI->rbHead = in_RDI->rbEnd;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12e389);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x12e393);
  return true;
}

Assistant:

bool update() {
            std::lock_guard<std::mutex> lock(mutex);
            if (isServer && isListening) {
                doListen();
            } else if (isServer && isListening == false && isConnected) {
                doRead();
            } else if (isServer == false && isConnecting) {
                doConnect();
            } else if (isServer == false && isConnecting == false && isConnected) {
                doRead();
            }
            {
                std::lock_guard<std::mutex> lock(mutexSend);
                if (isConnected && (rbHead != rbEnd)) {
                    doSend();
                }
                if (isConnected == false) {
                    rbHead = rbEnd;
                }
            }

            return true;
        }